

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<VkSurfaceFormatKHR> *
vkb::detail::find_desired_surface_format
          (Result<VkSurfaceFormatKHR> *__return_storage_ptr__,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *available_formats,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *desired_formats)

{
  bool bVar1;
  reference value;
  reference pVVar2;
  error_code eVar3;
  error_code error_code;
  VkSurfaceFormatKHR *available_format;
  const_iterator __end3;
  const_iterator __begin3;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range3;
  VkSurfaceFormatKHR *desired_format;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range2;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *desired_formats_local;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *available_formats_local;
  
  __end2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::begin
                     (desired_formats);
  desired_format =
       (VkSurfaceFormatKHR *)
       std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::end(desired_formats);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                *)&desired_format);
    if (!bVar1) {
      eVar3 = make_error_code(no_suitable_desired_format);
      error_code._M_cat = eVar3._M_cat;
      error_code._4_4_ = 0;
      error_code._M_value = eVar3._M_value;
      Result<VkSurfaceFormatKHR>::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
      return __return_storage_ptr__;
    }
    value = __gnu_cxx::
            __normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
            ::operator*(&__end2);
    __end3 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::begin
                       (available_formats);
    available_format =
         (VkSurfaceFormatKHR *)
         std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::end
                   (available_formats);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                       *)&available_format), bVar1) {
      pVVar2 = __gnu_cxx::
               __normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
               ::operator*(&__end3);
      if ((value->format == pVVar2->format) && (value->colorSpace == pVVar2->colorSpace)) {
        Result<VkSurfaceFormatKHR>::Result(__return_storage_ptr__,value);
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Result<VkSurfaceFormatKHR> find_desired_surface_format(
    std::vector<VkSurfaceFormatKHR> const& available_formats, std::vector<VkSurfaceFormatKHR> const& desired_formats) {
    for (auto const& desired_format : desired_formats) {
        for (auto const& available_format : available_formats) {
            // finds the first format that is desired and available
            if (desired_format.format == available_format.format && desired_format.colorSpace == available_format.colorSpace) {
                return desired_format;
            }
        }
    }

    // if no desired format is available, we report that no format is suitable to the user request
    return { make_error_code(SurfaceSupportError::no_suitable_desired_format) };
}